

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ziptool.c
# Opt level: O2

int set_file_dostime(int argc,char **argv)

{
  FILE *__stream;
  int iVar1;
  ulonglong uVar2;
  ulonglong uVar3;
  ulonglong uVar4;
  undefined8 uVar5;
  int iVar6;
  
  iVar6 = 0;
  uVar2 = strtoull(*argv,(char **)0x0,10);
  uVar3 = strtoull(argv[1],(char **)0x0,10);
  uVar4 = strtoull(argv[2],(char **)0x0,10);
  iVar1 = zip_file_set_dostime(za,uVar2,(uint)uVar3 & 0xffff,(uint)uVar4 & 0xffff,0);
  __stream = _stderr;
  if (iVar1 < 0) {
    uVar5 = zip_strerror(za);
    fprintf(__stream,"can\'t set file dostime at index \'%lu\' to \'%d\'/\'%d\': %s\n",uVar2,
            (ulong)((uint)uVar3 & 0xffff),(ulong)((uint)uVar4 & 0xffff),uVar5);
    iVar6 = -1;
  }
  return iVar6;
}

Assistant:

static int
set_file_dostime(int argc, char *argv[]) {
    /* set file last modification time (mtime) directly */
    zip_uint16_t dostime, dosdate;
    zip_uint64_t idx;
    idx = strtoull(argv[0], NULL, 10);
    dostime = (zip_uint16_t)strtoull(argv[1], NULL, 10);
    dosdate = (zip_uint16_t)strtoull(argv[2], NULL, 10);
    if (zip_file_set_dostime(za, idx, dostime, dosdate, 0) < 0) {
	fprintf(stderr, "can't set file dostime at index '%" PRIu64 "' to '%d'/'%d': %s\n", idx, (int)dostime, (int)dosdate, zip_strerror(za));
	return -1;
    }
    return 0;
}